

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O1

Float __thiscall pbrt::PMJ02BNSampler::Get1D(PMJ02BNSampler *this)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  
  uVar2 = this->samplesPerPixel;
  uVar3 = this->dimension;
  uVar7 = (long)this->seed ^ (long)(int)uVar3 << 0x10 ^
          (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.y << 0x20 ^
          (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.x << 0x30;
  uVar7 = (uVar7 >> 0x1f ^ uVar7) * 0x7fb5d329728ea185;
  lVar8 = (uVar7 >> 0x1b ^ uVar7) * -0x7e25210b43d22bb3;
  uVar6 = (uint)((ulong)lVar8 >> 0x21) ^ (uint)lVar8;
  uVar5 = this->sampleIndex;
  uVar9 = uVar2 - 1 >> 1 | uVar2 - 1;
  uVar9 = uVar9 >> 2 | uVar9;
  uVar9 = uVar9 >> 4 | uVar9;
  uVar9 = uVar9 >> 8 | uVar9;
  uVar9 = uVar9 >> 0x10 | uVar9;
  do {
    uVar5 = (uVar5 ^ uVar6) * -0x1e8f76c3 ^ uVar6 >> 0x10;
    uVar5 = ((uVar5 & uVar9) >> 4 ^ uVar6 >> 8 ^ uVar5) * 0x929eb3f ^ uVar6 >> 0x17;
    uVar5 = ((uVar5 & uVar9) >> 1 ^ uVar5) * (uVar6 >> 0x1b | 1) * 0x6935fa69;
    uVar5 = ((uVar5 & uVar9) >> 0xb ^ uVar5) * 0x74dcb303;
    uVar5 = ((uVar5 & uVar9) >> 2 ^ uVar5) * -0x61afe33d;
    uVar5 = ((uVar5 & uVar9) >> 2 ^ uVar5) * -0x379f5c21 & uVar9;
    uVar5 = uVar5 >> 5 ^ uVar5;
  } while (uVar2 <= uVar5);
  if ((-1 < (int)uVar3) &&
     (TVar4 = (this->pixel).super_Tuple2<pbrt::Point2,_int>,
     ((ulong)TVar4 & 0x8000000080000000) == 0)) {
    uVar1 = *(ushort *)
             (BlueNoiseTextures +
             (ulong)(TVar4.y & 0x7f) * 2 +
             (ulong)((TVar4.x & 0x7fU) << 8) + (ulong)(uVar3 % 0x30 << 0xf));
    this->dimension = uVar3 + 1;
    auVar10._0_4_ =
         ((float)uVar1 / 65535.0 + (float)(int)((uVar5 + uVar6) % uVar2)) / (float)(int)uVar2;
    auVar10._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar10 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar10);
    return auVar10._0_4_;
  }
  LogFatal<char_const(&)[42]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/bluenoise.h"
             ,0x1a,"Check failed: %s",(char (*) [42])"textureIndex >= 0 && p.x >= 0 && p.y >= 0");
}

Assistant:

PBRT_CPU_GPU
    Float Get1D() {
        // Find permuted sample index for 1D PMJ02BNSampler sample
        uint64_t hash = MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                                ((uint64_t)dimension << 16) ^ seed);
        int index = PermutationElement(sampleIndex, samplesPerPixel, hash);

        Float delta = BlueNoise(dimension, pixel);
        ++dimension;
        return std::min((index + delta) / samplesPerPixel, OneMinusEpsilon);
    }